

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QPluginParsedMetaData>::relocate
          (QArrayDataPointer<QPluginParsedMetaData> *this,qsizetype offset,
          QPluginParsedMetaData **data)

{
  bool bVar1;
  QPluginParsedMetaData *in_RDX;
  long in_RSI;
  QPluginParsedMetaData *in_RDI;
  QPluginParsedMetaData *res;
  QCborContainerPrivate *n;
  
  n = (QCborContainerPrivate *)(&((in_RDI->data).container)->super_QSharedData + in_RSI * 6);
  QtPrivate::q_relocate_overlap_n<QPluginParsedMetaData,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (QPluginParsedMetaData *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QPluginParsedMetaData>,QPluginParsedMetaData_const*>
                        (data,(QArrayDataPointer<QPluginParsedMetaData> *)res), bVar1)) {
    (in_RDX->data).n = in_RSI * 0x18 + (in_RDX->data).n;
  }
  (in_RDI->data).container = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }